

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O1

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,An an)

{
  Syntax SVar1;
  char *pcVar2;
  char cVar3;
  
  SVar1 = this->style->syntax;
  if (SVar1 == MOIRA_MIT) {
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '%';
LAB_00130660:
    cVar3 = 'A';
  }
  else {
    cVar3 = 'a';
    if (SVar1 != GNU) {
      if (SVar1 != GNU_MIT) goto LAB_00130660;
      pcVar2 = this->ptr;
      this->ptr = pcVar2 + 1;
      *pcVar2 = '%';
    }
  }
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = cVar3;
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = (char)an.raw + '0';
  SVar1 = this->style->syntax;
  if (SVar1 != GNU) {
    if (SVar1 != GNU_MIT) {
      return this;
    }
    if (an.raw == 7) goto LAB_001306b0;
    if (an.raw != 6) {
      return this;
    }
    this->ptr[-2] = 'f';
    this->ptr[-1] = 'p';
  }
  if (an.raw != 7) {
    return this;
  }
LAB_001306b0:
  this->ptr[-2] = 's';
  this->ptr[-1] = 'p';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(An an)
{
    switch (style.syntax) {

        case Syntax::GNU_MIT:      *ptr++ = '%'; [[fallthrough]];
       case Syntax::GNU:          *ptr++ = 'a'; *ptr++ = '0' + (char)an.raw; break;
        case Syntax::MOIRA_MIT:    *ptr++ = '%'; [[fallthrough]];
        
        default:
            *ptr++ = 'A'; *ptr++ = '0' + (char)an.raw; break;
    }

    switch (style.syntax) {

        case Syntax::GNU_MIT:

            if (an.raw == 6) { ptr[-2] = 'f'; ptr[-1] = 'p'; }
            [[fallthrough]];

       case Syntax::GNU:

            if (an.raw == 7) { ptr[-2] = 's'; ptr[-1] = 'p'; }
            break;

        default:
            break;
    }

    return *this;
}